

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::
init<Kernel::TypedTermList>(GenMatcher *this,TypedTermList query,uint nextSpecVar)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  TermList local_20;
  
  (this->_boundVars)._cursor = (this->_boundVars)._stack;
  puVar6 = &(this->_bindings)._timestamp;
  *puVar6 = *puVar6 + 1;
  auVar4 = _DAT_0084f040;
  auVar3 = _DAT_0084f030;
  auVar2 = _DAT_0084f020;
  if (*puVar6 == 0) {
    sVar1 = (this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._capacity;
    if (sVar1 != 0) {
      uVar7 = sVar1 + 0xfffffffffffffff;
      uVar8 = uVar7 & 0xfffffffffffffff;
      auVar10._8_4_ = (int)uVar8;
      auVar10._0_8_ = uVar8;
      auVar10._12_4_ = (int)(uVar8 >> 0x20);
      puVar6 = &(this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array[3].
                _timestamp;
      lVar9 = 0;
      auVar10 = auVar10 ^ _DAT_0084f040;
      do {
        auVar12._8_4_ = (int)lVar9;
        auVar12._0_8_ = lVar9;
        auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar13 = (auVar12 | auVar3) ^ auVar4;
        iVar11 = auVar10._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                    iVar11 < auVar13._4_4_) & 1)) {
          puVar6[-0xc] = 0;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          puVar6[-8] = 0;
        }
        auVar12 = (auVar12 | auVar2) ^ auVar4;
        iVar14 = auVar12._4_4_;
        if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
          puVar6[-4] = 0;
          *puVar6 = 0;
        }
        lVar9 = lVar9 + 4;
        puVar6 = puVar6 + 0x10;
      } while ((uVar8 - ((uint)uVar7 & 3)) + 4 != lVar9);
    }
    (this->_bindings)._timestamp = 1;
  }
  local_20._content = query.super_TermList._content._content;
  uVar5 = Kernel::TermList::weight(&local_20);
  this->_maxVar = uVar5 - 1;
  uVar7 = (this->_specVars)._size;
  if (uVar7 < nextSpecVar) {
    uVar5 = (int)uVar7 * 2;
    if (uVar5 <= nextSpecVar) {
      uVar5 = nextSpecVar;
    }
    Lib::DArray<Kernel::TermList>::ensure(&this->_specVars,(ulong)uVar5);
  }
  local_20._content = query.super_TermList._content._content;
  uVar5 = Kernel::TermList::weight(&local_20);
  Lib::DArray<Lib::ArrayMapEntry<Kernel::TermList>_>::ensure
            (&(this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>,(ulong)uVar5);
  return;
}

Assistant:

void init(TermOrLit query, unsigned nextSpecVar)
      {
        _boundVars.reset();
        // _specVars->reset(); <- does not need to be reset as we only write before we read 
        _bindings.reset();

        _maxVar = weight(query) - 1;
        if(_specVars.size()<nextSpecVar) {
          //_specVars can get really big, but it was introduced instead of hash table
          //during optimizations, as it raised performance by abour 5%.
          _specVars.ensure(std::max(static_cast<unsigned>(_specVars.size()*2), nextSpecVar));
        }
        _bindings.ensure(weight(query));
      }